

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O0

void Mips_printInst(MCInst *MI,SStream *O,void *info)

{
  uint uVar1;
  mips_reg Op;
  MCInst *in_RDI;
  MCRegisterInfo *in_stack_00000010;
  char *mnem;
  void *in_stack_000000b8;
  SStream *in_stack_000000c0;
  MCInst *in_stack_000000c8;
  SStream *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  char *local_20;
  
  uVar1 = MCInst_getOpcode(in_RDI);
  if ((1 < uVar1 - 0x582) && (1 < uVar1 - 0x68b)) {
    local_20 = printAliasInstr(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
    if ((local_20 == (char *)0x0) &&
       (local_20 = printAlias((MCInst *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                              in_stack_ffffffffffffffd0), local_20 == (char *)0x0)) {
      printInstruction((MCInst *)info,(SStream *)mnem,in_stack_00000010);
    }
    if (local_20 != (char *)0x0) {
      Op = Mips_map_insn((char *)in_RDI);
      MCInst_setOpcodePub(in_RDI,Op);
      (*cs_mem_free)(local_20);
    }
  }
  return;
}

Assistant:

void Mips_printInst(MCInst *MI, SStream *O, void *info)
{
	char *mnem;

	switch (MCInst_getOpcode(MI)) {
		default: break;
		case Mips_Save16:
		case Mips_SaveX16:
		case Mips_Restore16:
		case Mips_RestoreX16:
			return;
	}

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, info);
	if (!mnem) {
		mnem = printAlias(MI, O);
		if (!mnem) {
			printInstruction(MI, O, NULL);
		}
	}

	if (mnem) {
		// fixup instruction id due to the change in alias instruction
		MCInst_setOpcodePub(MI, Mips_map_insn(mnem));
		cs_mem_free(mnem);
	}
}